

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_add_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  container_t *c;
  container_t *container2;
  uint32_t local_40;
  int32_t iStack_3c;
  uint8_t newtypecode;
  uint32_t val;
  int containerindex;
  size_t i;
  uint32_t prev;
  uint8_t typecode;
  container_t *container;
  uint32_t *vals_local;
  size_t n_args_local;
  roaring_bitmap_t *r_local;
  
  _prev = (container_t *)0x0;
  i._7_1_ = '\0';
  i._0_4_ = 0;
  _val = (uint32_t *)0x0;
  iStack_3c = 0;
  if (n_args != 0) {
    local_40 = *vals;
    container = vals;
    vals_local = (uint32_t *)n_args;
    n_args_local = (size_t)r;
    _prev = containerptr_roaring_bitmap_add
                      (r,local_40,(uint8_t *)((long)&i + 7),&stack0xffffffffffffffc4);
    i._0_4_ = local_40;
    while (_val = (uint32_t *)((long)_val + 1), _val < vals_local) {
      local_40 = *(uint *)((long)container + (long)_val * 4);
      if (((uint)i ^ local_40) >> 0x10 == 0) {
        container2._7_1_ = i._7_1_;
        c = container_add(_prev,(uint16_t)local_40,i._7_1_,(uint8_t *)((long)&container2 + 7));
        if (c != _prev) {
          container_free(_prev,i._7_1_);
          ra_set_container_at_index((roaring_array_t *)n_args_local,iStack_3c,c,container2._7_1_);
          i._7_1_ = container2._7_1_;
          _prev = c;
        }
      }
      else {
        _prev = containerptr_roaring_bitmap_add
                          ((roaring_bitmap_t *)n_args_local,local_40,(uint8_t *)((long)&i + 7),
                           &stack0xffffffffffffffc4);
      }
      i._0_4_ = local_40;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_many(roaring_bitmap_t *r, size_t n_args,
                             const uint32_t *vals) {
    container_t *container = NULL;  // hold value of last container touched
    uint8_t typecode = 0;    // typecode of last container touched
    uint32_t prev = 0;       // previous valued inserted
    size_t i = 0;            // index of value
    int containerindex = 0;
    if (n_args == 0) return;
    uint32_t val;
    memcpy(&val, vals + i, sizeof(val));
    container =
        containerptr_roaring_bitmap_add(r, val, &typecode, &containerindex);
    prev = val;
    i++;
    for (; i < n_args; i++) {
        memcpy(&val, vals + i, sizeof(val));
        if (((prev ^ val) >> 16) ==
            0) {  // no need to seek the container, it is at hand
            // because we already have the container at hand, we can do the
            // insertion
            // automatically, bypassing the roaring_bitmap_add call
            uint8_t newtypecode = typecode;
            container_t *container2 =
                container_add(container, val & 0xFFFF, typecode, &newtypecode);
            if (container2 != container) {  // rare instance when we need to
                                            // change the container type
                container_free(container, typecode);
                ra_set_container_at_index(&r->high_low_container,
                                          containerindex, container2,
                                          newtypecode);
                typecode = newtypecode;
                container = container2;
            }
        } else {
            container = containerptr_roaring_bitmap_add(r, val, &typecode,
                                                        &containerindex);
        }
        prev = val;
    }
}